

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprIsAlnum(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  uint uVar1;
  i64 iVar2;
  u8 aArr [32];
  
  if (nArg == 1) {
    aArr[0x10] = '\0';
    aArr[0x11] = '\0';
    aArr[0x12] = '\0';
    aArr[0x13] = '\0';
    aArr[0x14] = '\0';
    aArr[0x15] = '\0';
    aArr[0x16] = '\0';
    aArr[0x17] = '\0';
    aArr[0x18] = '\0';
    aArr[0x19] = '\0';
    aArr[0x1a] = '\0';
    aArr[0x1b] = '\0';
    aArr[0x1c] = '\0';
    aArr[0x1d] = '\0';
    aArr[0x1e] = '\0';
    aArr[0x1f] = '\0';
    aArr[0] = '\0';
    aArr[1] = '\0';
    aArr[2] = '\0';
    aArr[3] = '\0';
    aArr[4] = '\0';
    aArr[5] = '\0';
    aArr[6] = '\0';
    aArr[7] = '\0';
    aArr[8] = '\0';
    aArr[9] = '\0';
    aArr[10] = '\0';
    aArr[0xb] = '\0';
    aArr[0xc] = '\0';
    aArr[0xd] = '\0';
    aArr[0xe] = '\0';
    aArr[0xf] = '\0';
    sqlite3Fts5UnicodeCatParse("L*",aArr);
    sqlite3Fts5UnicodeCatParse("N*",aArr);
    sqlite3Fts5UnicodeCatParse("Co",aArr);
    iVar2 = sqlite3VdbeIntValue(*apVal);
    uVar1 = sqlite3Fts5UnicodeCategory((u32)iVar2);
    sqlite3_result_int(pCtx,(uint)aArr[uVar1]);
    return;
  }
  sqlite3_result_error(pCtx,"wrong number of arguments to function fts5_isalnum",-1);
  return;
}

Assistant:

static void fts5ExprIsAlnum(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal           /* Function arguments */
){
  int iCode;
  u8 aArr[32];
  if( nArg!=1 ){
    sqlite3_result_error(pCtx, 
        "wrong number of arguments to function fts5_isalnum", -1
    );
    return;
  }
  memset(aArr, 0, sizeof(aArr));
  sqlite3Fts5UnicodeCatParse("L*", aArr);
  sqlite3Fts5UnicodeCatParse("N*", aArr);
  sqlite3Fts5UnicodeCatParse("Co", aArr);
  iCode = sqlite3_value_int(apVal[0]);
  sqlite3_result_int(pCtx, aArr[sqlite3Fts5UnicodeCategory((u32)iCode)]);
}